

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O1

bool __thiscall QPixmap::save(QPixmap *this,QString *fileName,char *format,int quality)

{
  QPlatformPixmap *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QImageWriter writer;
  QByteArray local_50;
  QImageWriter local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->data).d.ptr;
  if ((pQVar1 == (QPlatformPixmap *)0x0) || (pQVar1->is_null != false)) {
    bVar2 = false;
  }
  else {
    local_38.d = (QImageWriterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_50,format,-1);
    QImageWriter::QImageWriter(&local_38,fileName,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    bVar2 = doImageIO(this,&local_38,quality);
    QImageWriter::~QImageWriter(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QPixmap::save(const QString &fileName, const char *format, int quality) const
{
    if (isNull())
        return false;                                // nothing to save
    QImageWriter writer(fileName, format);
    return doImageIO(&writer, quality);
}